

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic-expr-visitor.h
# Opt level: O2

EExpr * __thiscall
mp::
BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
::Visit(EExpr *__return_storage_ptr__,
       BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
       *this,Expr e)

{
  double dVar1;
  
  switch(*(undefined4 *)e.super_ExprBase.impl_) {
  case 2:
    AlgebraicExpression<mp::QuadAndLinTerms>::AlgebraicExpression
              (&__return_storage_ptr__->super_QuadraticExpr,
               (Variable)*(int *)((long)e.super_ExprBase.impl_ + 4));
    break;
  case 3:
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::VisitCommonExpr(__return_storage_ptr__,
                      (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                       *)this,(Reference)e.super_ExprBase.impl_);
    break;
  case 4:
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::VisitMinus(__return_storage_ptr__,
                 (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                  *)this,(UnaryExpr)e.super_ExprBase.impl_);
    break;
  case 5:
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::VisitAbs(__return_storage_ptr__,
               (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                *)this,(UnaryExpr)e.super_ExprBase.impl_);
    break;
  case 6:
  case 7:
  case 0x1b:
  case 0x1e:
  case 0x1f:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x29:
  case 0x2e:
  case 0x45:
  case 0x46:
  case 0x47:
    VisitUnsupported(__return_storage_ptr__,this,e);
    break;
  case 8:
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::VisitSqrt(__return_storage_ptr__,
                (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                 *)this,(UnaryExpr)e.super_ExprBase.impl_);
    break;
  case 9:
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::VisitPow2(__return_storage_ptr__,
                (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                 *)this,(UnaryExpr)e.super_ExprBase.impl_);
    break;
  case 10:
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::VisitExp(__return_storage_ptr__,
               (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                *)this,(UnaryExpr)e.super_ExprBase.impl_);
    break;
  case 0xb:
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::VisitLog(__return_storage_ptr__,
               (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                *)this,(UnaryExpr)e.super_ExprBase.impl_);
    break;
  case 0xc:
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::VisitLog10(__return_storage_ptr__,
                 (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                  *)this,(UnaryExpr)e.super_ExprBase.impl_);
    break;
  case 0xd:
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::VisitSin(__return_storage_ptr__,
               (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                *)this,(UnaryExpr)e.super_ExprBase.impl_);
    break;
  case 0xe:
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::VisitSinh(__return_storage_ptr__,
                (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                 *)this,(UnaryExpr)e.super_ExprBase.impl_);
    break;
  case 0xf:
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::VisitCos(__return_storage_ptr__,
               (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                *)this,(UnaryExpr)e.super_ExprBase.impl_);
    break;
  case 0x10:
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::VisitCosh(__return_storage_ptr__,
                (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                 *)this,(UnaryExpr)e.super_ExprBase.impl_);
    break;
  case 0x11:
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::VisitTan(__return_storage_ptr__,
               (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                *)this,(UnaryExpr)e.super_ExprBase.impl_);
    break;
  case 0x12:
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::VisitTanh(__return_storage_ptr__,
                (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                 *)this,(UnaryExpr)e.super_ExprBase.impl_);
    break;
  case 0x13:
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::VisitAsin(__return_storage_ptr__,
                (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                 *)this,(UnaryExpr)e.super_ExprBase.impl_);
    break;
  case 0x14:
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::VisitAsinh(__return_storage_ptr__,
                 (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                  *)this,(UnaryExpr)e.super_ExprBase.impl_);
    break;
  case 0x15:
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::VisitAcos(__return_storage_ptr__,
                (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                 *)this,(UnaryExpr)e.super_ExprBase.impl_);
    break;
  case 0x16:
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::VisitAcosh(__return_storage_ptr__,
                 (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                  *)this,(UnaryExpr)e.super_ExprBase.impl_);
    break;
  case 0x17:
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::VisitAtan(__return_storage_ptr__,
                (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                 *)this,(UnaryExpr)e.super_ExprBase.impl_);
    break;
  case 0x18:
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::VisitAtanh(__return_storage_ptr__,
                 (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                  *)this,(UnaryExpr)e.super_ExprBase.impl_);
    break;
  case 0x19:
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::VisitAdd(__return_storage_ptr__,
               (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                *)this,(BinaryExpr)e.super_ExprBase.impl_);
    break;
  case 0x1a:
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::VisitSub(__return_storage_ptr__,
               (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                *)this,(BinaryExpr)e.super_ExprBase.impl_);
    break;
  case 0x1c:
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::VisitMul(__return_storage_ptr__,
               (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                *)this,(BinaryExpr)e.super_ExprBase.impl_);
    break;
  case 0x1d:
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::VisitDiv(__return_storage_ptr__,
               (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                *)this,(BinaryExpr)e.super_ExprBase.impl_);
    break;
  case 0x20:
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::VisitPow(__return_storage_ptr__,
               (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                *)this,(BinaryExpr)e.super_ExprBase.impl_);
    break;
  case 0x21:
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::VisitPowConstBase(__return_storage_ptr__,
                        (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                         *)this,(BinaryExpr)e.super_ExprBase.impl_);
    break;
  case 0x22:
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::VisitPowConstExp(__return_storage_ptr__,
                       (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                        *)this,(BinaryExpr)e.super_ExprBase.impl_);
    break;
  case 0x27:
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::VisitIf(__return_storage_ptr__,
              (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               *)this,(IfExpr)e.super_ExprBase.impl_);
    break;
  case 0x28:
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::VisitPLTerm(__return_storage_ptr__,
                  (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                   *)this,(PLTerm)e.super_ExprBase.impl_);
    break;
  case 0x2a:
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
    ::
    VisitFunctionalExpression<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MinId>,mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)42,(mp::expr::Kind)45>>
              (__return_storage_ptr__,
               (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
                *)this,(BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
                        )e.super_ExprBase.impl_);
    break;
  case 0x2b:
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
    ::
    VisitFunctionalExpression<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>,mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)42,(mp::expr::Kind)45>>
              (__return_storage_ptr__,
               (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
                *)this,(BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
                        )e.super_ExprBase.impl_);
    break;
  case 0x2c:
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::VisitSum(__return_storage_ptr__,
               (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                *)this,(SumExpr)e.super_ExprBase.impl_);
    break;
  case 0x2d:
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::VisitNumberOf(__return_storage_ptr__,
                    (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                     *)this,(NumberOfExpr)e.super_ExprBase.impl_);
    break;
  case 0x2f:
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
    ::
    VisitFunctionalExpression<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::CountId>,mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)47,(mp::expr::Kind)47>>
              (__return_storage_ptr__,
               (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
                *)this,(BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)47,_(mp::expr::Kind)47>
                        )e.super_ExprBase.impl_);
    break;
  case 0x30:
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::VisitLogicalConstant
              (__return_storage_ptr__,
               (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                *)this,(LogicalConstant)e.super_ExprBase.impl_);
    break;
  case 0x31:
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::VisitNot(__return_storage_ptr__,
               (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                *)this,(NotExpr)e.super_ExprBase.impl_);
    break;
  case 0x32:
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::VisitOr(__return_storage_ptr__,
              (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               *)this,(BinaryLogicalExpr)e.super_ExprBase.impl_);
    break;
  case 0x33:
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::VisitAnd(__return_storage_ptr__,
               (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                *)this,(BinaryLogicalExpr)e.super_ExprBase.impl_);
    break;
  case 0x34:
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::VisitIff(__return_storage_ptr__,
               (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                *)this,(BinaryLogicalExpr)e.super_ExprBase.impl_);
    break;
  case 0x35:
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::VisitLT(__return_storage_ptr__,
              (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               *)this,(RelationalExpr)e.super_ExprBase.impl_);
    break;
  case 0x36:
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::VisitLE(__return_storage_ptr__,
              (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               *)this,(RelationalExpr)e.super_ExprBase.impl_);
    break;
  case 0x37:
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::VisitEQ(__return_storage_ptr__,
              (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               *)this,(RelationalExpr)e.super_ExprBase.impl_);
    break;
  case 0x38:
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::VisitGE(__return_storage_ptr__,
              (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               *)this,(RelationalExpr)e.super_ExprBase.impl_);
    break;
  case 0x39:
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::VisitGT(__return_storage_ptr__,
              (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               *)this,(RelationalExpr)e.super_ExprBase.impl_);
    break;
  case 0x3a:
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::VisitNE(__return_storage_ptr__,
              (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               *)this,(RelationalExpr)e.super_ExprBase.impl_);
    break;
  case 0x3b:
    ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
    ::VisitAtLeast(__return_storage_ptr__,
                   (ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
                    *)this,(LogicalCountExpr)e.super_ExprBase.impl_);
    break;
  case 0x3c:
    ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
    ::VisitAtMost(__return_storage_ptr__,
                  (ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
                   *)this,(LogicalCountExpr)e.super_ExprBase.impl_);
    break;
  case 0x3d:
    ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
    ::VisitExactly(__return_storage_ptr__,
                   (ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
                    *)this,(LogicalCountExpr)e.super_ExprBase.impl_);
    break;
  case 0x3e:
    ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
    ::VisitNotAtLeast(__return_storage_ptr__,
                      (ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
                       *)this,(LogicalCountExpr)e.super_ExprBase.impl_);
    break;
  case 0x3f:
    ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
    ::VisitNotAtMost(__return_storage_ptr__,
                     (ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
                      *)this,(LogicalCountExpr)e.super_ExprBase.impl_);
    break;
  case 0x40:
    ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
    ::VisitNotExactly(__return_storage_ptr__,
                      (ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
                       *)this,(LogicalCountExpr)e.super_ExprBase.impl_);
    break;
  case 0x41:
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::VisitImplication(__return_storage_ptr__,
                       (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                        *)this,(ImplicationExpr)e.super_ExprBase.impl_);
    break;
  case 0x42:
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
    ::
    VisitFunctionalExpression<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::LogicalFunctionalConstraintTraits,mp::OrId>,mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)66,(mp::expr::Kind)67>>
              (__return_storage_ptr__,
               (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
                *)this,(BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)66,_(mp::expr::Kind)67>
                        )e.super_ExprBase.impl_);
    break;
  case 0x43:
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
    ::
    VisitFunctionalExpression<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::LogicalFunctionalConstraintTraits,mp::AndId>,mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)66,(mp::expr::Kind)67>>
              (__return_storage_ptr__,
               (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
                *)this,(BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)66,_(mp::expr::Kind)67>
                        )e.super_ExprBase.impl_);
    break;
  case 0x44:
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::VisitAllDiff(__return_storage_ptr__,
                   (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                    *)this,(PairwiseExpr)e.super_ExprBase.impl_);
    break;
  default:
    dVar1 = *(double *)((long)e.super_ExprBase.impl_ + 8);
    QuadAndLinTerms::QuadAndLinTerms((QuadAndLinTerms *)__return_storage_ptr__);
    (__return_storage_ptr__->super_QuadraticExpr).constant_term_ = dVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

Result BasicExprVisitor<Impl, Result, ET>::Visit(Expr e) {
  // All expressions except OPNUMBEROFs and OPIFSYM are supported.
  switch (e.kind()) {
  default:
    MP_ASSERT(false, "invalid expression");
    // Fall through.
  case expr::NUMBER:
    return MP_DISPATCH(VisitNumericConstant(
                         ET::template UncheckedCast<NumericConstant>(e)));
  case expr::VARIABLE:
    return MP_DISPATCH(VisitVariable(ET::template UncheckedCast<Variable>(e)));
  case expr::COMMON_EXPR:
    return MP_DISPATCH(VisitCommonExpr(
                         ET::template UncheckedCast<CommonExpr>(e)));

  // Unary expressions.
  case expr::MINUS:
    return MP_DISPATCH(VisitMinus(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::ABS:
    return MP_DISPATCH(VisitAbs(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::FLOOR:
    return MP_DISPATCH(VisitFloor(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::CEIL:
    return MP_DISPATCH(VisitCeil(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::SQRT:
    return MP_DISPATCH(VisitSqrt(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::POW2:
    return MP_DISPATCH(VisitPow2(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::EXP:
    return MP_DISPATCH(VisitExp(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::LOG:
    return MP_DISPATCH(VisitLog(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::LOG10:
    return MP_DISPATCH(VisitLog10(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::SIN:
    return MP_DISPATCH(VisitSin(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::SINH:
    return MP_DISPATCH(VisitSinh(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::COS:
    return MP_DISPATCH(VisitCos(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::COSH:
    return MP_DISPATCH(VisitCosh(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::TAN:
    return MP_DISPATCH(VisitTan(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::TANH:
    return MP_DISPATCH(VisitTanh(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::ASIN:
    return MP_DISPATCH(VisitAsin(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::ASINH:
    return MP_DISPATCH(VisitAsinh(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::ACOS:
    return MP_DISPATCH(VisitAcos(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::ACOSH:
    return MP_DISPATCH(VisitAcosh(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::ATAN:
    return MP_DISPATCH(VisitAtan(ET::template UncheckedCast<UnaryExpr>(e)));
  case expr::ATANH:
    return MP_DISPATCH(VisitAtanh(ET::template UncheckedCast<UnaryExpr>(e)));

  // Binary expressions.
  case expr::ADD:
    return MP_DISPATCH(VisitAdd(ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::SUB:
    return MP_DISPATCH(VisitSub(ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::LESS:
    return MP_DISPATCH(VisitLess(ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::MUL:
    return MP_DISPATCH(VisitMul(ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::DIV:
    return MP_DISPATCH(VisitDiv(ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::TRUNC_DIV:
    return MP_DISPATCH(VisitTruncDiv(
                         ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::MOD:
    return MP_DISPATCH(VisitMod(ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::POW:
    return MP_DISPATCH(VisitPow(ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::POW_CONST_BASE:
    return MP_DISPATCH(VisitPowConstBase(
                         ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::POW_CONST_EXP:
    return MP_DISPATCH(VisitPowConstExp(
                         ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::ATAN2:
    return MP_DISPATCH(VisitAtan2(ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::PRECISION:
    return MP_DISPATCH(VisitPrecision(
                         ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::ROUND:
    return MP_DISPATCH(VisitRound(ET::template UncheckedCast<BinaryExpr>(e)));
  case expr::TRUNC:
    return MP_DISPATCH(VisitTrunc(ET::template UncheckedCast<BinaryExpr>(e)));

  case expr::IF:
    return MP_DISPATCH(VisitIf(ET::template UncheckedCast<IfExpr>(e)));
  case expr::PLTERM:
    return MP_DISPATCH(VisitPLTerm(ET::template UncheckedCast<PLTerm>(e)));
  case expr::CALL:
    return MP_DISPATCH(VisitCall(ET::template UncheckedCast<CallExpr>(e)));
  case expr::MIN:
    return MP_DISPATCH(VisitMin(ET::template UncheckedCast<VarArgExpr>(e)));
  case expr::MAX:
    return MP_DISPATCH(VisitMax(ET::template UncheckedCast<VarArgExpr>(e)));
  case expr::SUM:
    return MP_DISPATCH(VisitSum(ET::template UncheckedCast<SumExpr>(e)));
  case expr::NUMBEROF:
    return MP_DISPATCH(VisitNumberOf(
                         ET::template UncheckedCast<NumberOfExpr>(e)));
  case expr::NUMBEROF_SYM:
    return MP_DISPATCH(VisitNumberOfSym(
                         ET::template UncheckedCast<SymbolicNumberOfExpr>(e)));
  case expr::COUNT:
    return MP_DISPATCH(VisitCount(ET::template UncheckedCast<CountExpr>(e)));

    // Logical expressions.
  case expr::BOOL:
    return MP_DISPATCH(VisitLogicalConstant(
                         ET::template UncheckedCast<LogicalConstant>(e)));
  case expr::NOT:
    return MP_DISPATCH(VisitNot(ET::template UncheckedCast<NotExpr>(e)));
  case expr::OR:
    return MP_DISPATCH(VisitOr(
                         ET::template UncheckedCast<BinaryLogicalExpr>(e)));
  case expr::AND:
    return MP_DISPATCH(VisitAnd(
                         ET::template UncheckedCast<BinaryLogicalExpr>(e)));
  case expr::IFF:
    return MP_DISPATCH(VisitIff(
                         ET::template UncheckedCast<BinaryLogicalExpr>(e)));
  case expr::LT:
    return MP_DISPATCH(VisitLT(ET::template UncheckedCast<RelationalExpr>(e)));
  case expr::LE:
    return MP_DISPATCH(VisitLE(ET::template UncheckedCast<RelationalExpr>(e)));
  case expr::EQ:
    return MP_DISPATCH(VisitEQ(ET::template UncheckedCast<RelationalExpr>(e)));
  case expr::GE:
    return MP_DISPATCH(VisitGE(ET::template UncheckedCast<RelationalExpr>(e)));
  case expr::GT:
    return MP_DISPATCH(VisitGT(ET::template UncheckedCast<RelationalExpr>(e)));
  case expr::NE:
    return MP_DISPATCH(VisitNE(ET::template UncheckedCast<RelationalExpr>(e)));
  case expr::ATLEAST:
    return MP_DISPATCH(VisitAtLeast(
                         ET::template UncheckedCast<LogicalCountExpr>(e)));
  case expr::ATMOST:
    return MP_DISPATCH(VisitAtMost(
                         ET::template UncheckedCast<LogicalCountExpr>(e)));
  case expr::EXACTLY:
    return MP_DISPATCH(VisitExactly(
                         ET::template UncheckedCast<LogicalCountExpr>(e)));
  case expr::NOT_ATLEAST:
    return MP_DISPATCH(VisitNotAtLeast(
                         ET::template UncheckedCast<LogicalCountExpr>(e)));
  case expr::NOT_ATMOST:
    return MP_DISPATCH(VisitNotAtMost(
                         ET::template UncheckedCast<LogicalCountExpr>(e)));
  case expr::NOT_EXACTLY:
    return MP_DISPATCH(VisitNotExactly(
                         ET::template UncheckedCast<LogicalCountExpr>(e)));
  case expr::IMPLICATION:
    return MP_DISPATCH(VisitImplication(
                         ET::template UncheckedCast<ImplicationExpr>(e)));
  case expr::EXISTS:
    return MP_DISPATCH(VisitExists(
                         ET::template UncheckedCast<IteratedLogicalExpr>(e)));
  case expr::FORALL:
    return MP_DISPATCH(VisitForAll(
                         ET::template UncheckedCast<IteratedLogicalExpr>(e)));
  case expr::ALLDIFF:
    return MP_DISPATCH(VisitAllDiff(
                         ET::template UncheckedCast<PairwiseExpr>(e)));
  case expr::NOT_ALLDIFF:
    return MP_DISPATCH(VisitNotAllDiff(
                         ET::template UncheckedCast<PairwiseExpr>(e)));

    // String expressions.
  case expr::STRING:
    return MP_DISPATCH(VisitStringLiteral(
                         ET::template UncheckedCast<StringLiteral>(e)));
  case expr::IFSYM:
    return MP_DISPATCH(VisitSymbolicIf(
                         ET::template UncheckedCast<SymbolicIfExpr>(e)));
  }
}